

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<std::istream,int,unsigned_int>
               (SingleTreeIndex *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  undefined1 diff_endian_00;
  byte in_CL;
  vector<char,_std::allocator<char>_> *in_RDX;
  istream *in_RSI;
  size_t in_RDI;
  size_t vec_size;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  diff_endian_00 = in_CL & 1;
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)vec_size,in_RDI,in_RSI,
               in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
    read_bytes<double,double>
              ((vector<double,_std::allocator<double>_> *)in_RSI,(size_t)in_RDX,
               (istream *)CONCAT17(diff_endian_00,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
    read_bytes<double,double>
              ((vector<double,_std::allocator<double>_> *)in_RSI,(size_t)in_RDX,
               (istream *)CONCAT17(diff_endian_00,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)vec_size,in_RDI,in_RSI,
               in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)vec_size,in_RDI,in_RSI,
               in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)vec_size,in_RDI,in_RSI,
               in_RDX,(bool)diff_endian_00);
    read_bytes<unsigned_long,unsigned_int>
              ((void *)vec_size,in_RDI,in_RSI,in_RDX,(bool)diff_endian_00);
  }
  return;
}

Assistant:

void deserialize_node(SingleTreeIndex &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.terminal_node_mappings, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_distances, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_depths, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_points, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_indptr, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_mapping, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&node.n_terminal, (size_t)1, in, buffer, diff_endian);
}